

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

stbtt_int32 stbtt__GetGlyphClass(stbtt_uint8 *classDefTable,int glyph)

{
  stbtt_uint16 sVar1;
  stbtt_uint16 sVar2;
  int iVar3;
  stbtt_uint8 *p;
  int in_ESI;
  stbtt_uint8 *in_RDI;
  stbtt_uint8 *classRangeRecord;
  int needle;
  int strawEnd;
  int strawStart;
  stbtt_int32 m;
  stbtt_int32 r;
  stbtt_int32 l;
  stbtt_uint8 *classRangeRecords;
  stbtt_uint16 classRangeCount;
  stbtt_uint8 *classDef1ValueArray;
  stbtt_uint16 glyphCount;
  stbtt_uint16 startGlyphID;
  stbtt_uint16 classDefFormat;
  int local_40;
  int local_3c;
  
  sVar1 = ttUSHORT(in_RDI);
  if (sVar1 == 1) {
    sVar1 = ttUSHORT(in_RDI + 2);
    sVar2 = ttUSHORT(in_RDI + 4);
    if (((int)(uint)sVar1 <= in_ESI) && (in_ESI < (int)((uint)sVar1 + (uint)sVar2))) {
      sVar1 = ttUSHORT(in_RDI + (long)(int)((in_ESI - (uint)sVar1) * 2) + 6);
      return (uint)sVar1;
    }
  }
  else if (sVar1 == 2) {
    sVar1 = ttUSHORT(in_RDI + 2);
    local_3c = 0;
    local_40 = sVar1 - 1;
    while (local_3c <= local_40) {
      iVar3 = local_3c + local_40 >> 1;
      p = in_RDI + (long)(iVar3 * 6) + 4;
      sVar1 = ttUSHORT(p);
      sVar2 = ttUSHORT(p + 2);
      if (in_ESI < (int)(uint)sVar1) {
        local_40 = iVar3 + -1;
      }
      else {
        if (in_ESI <= (int)(uint)sVar2) {
          sVar1 = ttUSHORT(p + 4);
          return (uint)sVar1;
        }
        local_3c = iVar3 + 1;
      }
    }
  }
  return -1;
}

Assistant:

static stbtt_int32  stbtt__GetGlyphClass(stbtt_uint8 *classDefTable, int glyph)
{
stbtt_uint16 classDefFormat = ttUSHORT(classDefTable);
switch(classDefFormat)
{
case 1: {
stbtt_uint16 startGlyphID = ttUSHORT(classDefTable + 2);
stbtt_uint16 glyphCount = ttUSHORT(classDefTable + 4);
stbtt_uint8 *classDef1ValueArray = classDefTable + 6;

if (glyph >= startGlyphID && glyph < startGlyphID + glyphCount)
return (stbtt_int32)ttUSHORT(classDef1ValueArray + 2 * (glyph - startGlyphID));

classDefTable = classDef1ValueArray + 2 * glyphCount;
} break;

case 2: {
stbtt_uint16 classRangeCount = ttUSHORT(classDefTable + 2);
stbtt_uint8 *classRangeRecords = classDefTable + 4;

/*  Binary search. */
stbtt_int32 l=0, r=classRangeCount-1, m;
int strawStart, strawEnd, needle=glyph;
while (l <= r) {
stbtt_uint8 *classRangeRecord;
m = (l + r) >> 1;
classRangeRecord = classRangeRecords + 6 * m;
strawStart = ttUSHORT(classRangeRecord);
strawEnd = ttUSHORT(classRangeRecord + 2);
if (needle < strawStart)
r = m - 1;
else if (needle > strawEnd)
l = m + 1;
else
return (stbtt_int32)ttUSHORT(classRangeRecord + 4);
}

classDefTable = classRangeRecords + 6 * classRangeCount;
} break;

default: {
/*  There are no other cases. */
STBTT_assert(0);
} break;
}

return -1;
}